

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

char * Diligent::Parsing::SkipLine<char_const*>(char **Start,char **End,bool GoToNextLine)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar2 = (byte *)*End;
  pbVar4 = (byte *)*Start;
  do {
    pbVar3 = pbVar4;
    pbVar4 = pbVar3 + 1;
    if (pbVar3 == pbVar2) {
      return (char *)pbVar2;
    }
    bVar1 = *pbVar3;
  } while ((0xd < bVar1) || ((0x2401U >> (bVar1 & 0x1f) & 1) == 0));
  if ((GoToNextLine) && ((bVar1 == 10 || (bVar1 == 0xd)))) {
    if (pbVar4 == pbVar2 || bVar1 != 0xd) {
      return (char *)pbVar4;
    }
    pbVar3 = pbVar3 + 2;
    if (*pbVar4 != 10) {
      pbVar3 = pbVar4;
    }
  }
  return (char *)pbVar3;
}

Assistant:

InteratorType SkipLine(const InteratorType& Start, const InteratorType& End, bool GoToNextLine = false) noexcept
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0' && !IsNewLine(*Pos))
        ++Pos;
    if (GoToNextLine && Pos != End && IsNewLine(*Pos))
    {
        ++Pos;
        if (Pos[-1] == '\r' && Pos != End && Pos[0] == '\n')
        {
            ++Pos;
            // treat \r\n as a single ending
        }
    }
    return Pos;
}